

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

IntrusiveList<SynFunctionArgument> ParseFunctionArguments(ParseContext *ctx)

{
  IntrusiveList<SynFunctionArgument> IVar1;
  SynFunctionArgument *node;
  IntrusiveList<SynFunctionArgument> arguments;
  IntrusiveList<SynFunctionArgument> local_28;
  
  local_28.head = (SynFunctionArgument *)0x0;
  local_28.tail = (SynFunctionArgument *)0x0;
  node = ParseFunctionArgument(ctx,false,(SynBase *)0x0);
  if (node != (SynFunctionArgument *)0x0) {
    do {
      IntrusiveList<SynFunctionArgument>::push_back(&local_28,node);
      if (ctx->currentLexeme->type != lex_comma) goto LAB_00116def;
      ctx->currentLexeme = ctx->currentLexeme + 1;
      node = ParseFunctionArgument
                       (ctx,(bool)((local_28.tail)->super_SynBase).field_0x3a,(local_28.tail)->type)
      ;
    } while (node != (SynFunctionArgument *)0x0);
    anon_unknown.dwarf_147a9::Report
              (ctx,ctx->currentLexeme,
               "ERROR: argument name not found after \',\' in function argument list");
  }
LAB_00116def:
  IVar1.tail = local_28.tail;
  IVar1.head = local_28.head;
  return IVar1;
}

Assistant:

IntrusiveList<SynFunctionArgument> ParseFunctionArguments(ParseContext &ctx)
{
	IntrusiveList<SynFunctionArgument> arguments;

	if(SynFunctionArgument *argument = ParseFunctionArgument(ctx, false, NULL))
	{
		arguments.push_back(argument);

		while(ctx.Consume(lex_comma))
		{
			argument = ParseFunctionArgument(ctx, arguments.tail->isExplicit, arguments.tail->type);

			if(!argument)
			{
				Report(ctx, ctx.Current(), "ERROR: argument name not found after ',' in function argument list");

				break;
			}

			arguments.push_back(argument);
		}
	}

	return arguments;
}